

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O1

void af_cjk_metrics_init_widths(AF_CJKMetrics metrics,FT_Face face)

{
  char *pcVar1;
  FT_Memory pFVar2;
  FT_GlyphSlot pFVar3;
  AF_Segment_conflict pAVar4;
  ushort uVar5;
  AF_CJKAxisRec *pAVar6;
  FT_Error FVar7;
  char *pcVar8;
  ulong uVar9;
  AF_Segment_conflict pAVar10;
  AF_Segment_conflict pAVar11;
  long lVar12;
  ushort uVar13;
  int iVar14;
  bool bVar15;
  FT_ULong shaper_buf_;
  AF_GlyphHintsRec hints [1];
  AF_CJKMetricsRec dummy [1];
  FT_UInt local_aaec;
  AF_CJKAxisRec *local_aae8;
  long local_aae0;
  AF_GlyphHintsRec_ local_aad8;
  AF_StyleMetricsRec_ local_7868;
  FT_UInt local_7820;
  
  pFVar2 = face->memory;
  lVar12 = 0;
  memset(&local_aad8,0,0x1428);
  local_aae8 = metrics->axis;
  metrics->axis[0].width_count = 0;
  metrics->axis[1].width_count = 0;
  pcVar8 = af_script_classes[((metrics->root).style_class)->script]->standard_charstring;
  local_aad8.memory = pFVar2;
  do {
    if (*pcVar8 == '\0') break;
    pcVar8 = pcVar8 + -1;
    do {
      pcVar1 = pcVar8 + 1;
      pcVar8 = pcVar8 + 1;
    } while (*pcVar1 == ' ');
    pcVar8 = af_shaper_get_cluster(pcVar8,&metrics->root,&local_aae0,(uint *)&local_7868);
    if (1 >= (uint)local_7868.style_class) {
      lVar12 = local_aae0;
    }
  } while (1 < (uint)local_7868.style_class || local_aae0 == 0);
  if (((lVar12 != 0) && (FVar7 = FT_Load_Glyph(face,(FT_UInt)lVar12,1), FVar7 == 0)) &&
     (pFVar3 = face->glyph, 0 < (pFVar3->outline).n_points)) {
    memset(&local_7868,0,0x7830);
    local_7820 = metrics->units_per_em;
    local_7868.scaler.x_scale = 0x10000;
    local_7868.scaler.y_scale = 0x10000;
    local_7868.scaler.x_delta = 0;
    local_7868.scaler.y_delta = 0;
    local_7868.scaler.render_mode = FT_RENDER_MODE_NORMAL;
    local_7868.scaler.flags = 0;
    local_aad8.scaler_flags = 0;
    local_aad8.metrics = &local_7868;
    local_7868.scaler.face = face;
    FVar7 = af_glyph_hints_reload(&local_aad8,&pFVar3->outline);
    if (FVar7 == 0) {
      lVar12 = 0;
      do {
        local_aaec = 0;
        FVar7 = af_latin_hints_compute_segments(&local_aad8,(AF_Dimension)lVar12);
        pAVar6 = local_aae8;
        if (FVar7 != 0) break;
        af_latin_hints_link_segments(&local_aad8,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar12);
        uVar9 = (ulong)local_aad8.axis[lVar12].num_segments;
        if (uVar9 != 0) {
          pAVar10 = local_aad8.axis[lVar12].segments;
          pAVar11 = pAVar10 + uVar9;
          do {
            pAVar4 = pAVar10->link;
            if ((pAVar4 != (AF_Segment_conflict)0x0) &&
               ((local_aaec < 0x10 && pAVar10 < pAVar4) && pAVar10 == pAVar4->link)) {
              iVar14 = (int)pAVar10->pos - (int)pAVar4->pos;
              uVar5 = (ushort)iVar14;
              uVar13 = -uVar5;
              if (0 < iVar14) {
                uVar13 = uVar5;
              }
              uVar9 = (ulong)local_aaec;
              local_aaec = local_aaec + 1;
              pAVar6[lVar12].widths[uVar9].org = (ulong)uVar13;
            }
            pAVar10 = pAVar10 + 1;
          } while (pAVar10 < pAVar11);
        }
        af_sort_and_quantize_widths(&local_aaec,pAVar6[lVar12].widths,(ulong)local_7820 / 100);
        pAVar6[lVar12].width_count = local_aaec;
        bVar15 = lVar12 == 0;
        lVar12 = lVar12 + 1;
      } while (bVar15);
    }
  }
  lVar12 = 0x1f8;
  do {
    if (*(int *)((long)metrics + lVar12 + -0x198) == 0) {
      uVar9 = (ulong)metrics->units_per_em * 0x32 >> 0xb;
    }
    else {
      uVar9 = *(ulong *)((long)metrics + lVar12 + -400);
    }
    *(long *)((long)(metrics->axis[0].widths + -5) + lVar12) = (long)uVar9 / 5;
    *(ulong *)((long)metrics->axis[0].widths + lVar12 + -0x70) = uVar9;
    *(undefined1 *)((long)metrics->axis[0].widths + lVar12 + -0x68) = 0;
    lVar12 = lVar12 + 0x3bf0;
  } while (lVar12 == 0x3de8);
  af_glyph_hints_done(&local_aad8);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_cjk_metrics_init_widths( AF_CJKMetrics  metrics,
                              FT_Face        face )
  {
    /* scan the array of segments in each direction */
    AF_GlyphHintsRec  hints[1];


    FT_TRACE5(( "\n" ));
    FT_TRACE5(( "cjk standard widths computation (style `%s')\n",
                af_style_names[metrics->root.style_class->style] ));
    FT_TRACE5(( "===================================================\n" ));
    FT_TRACE5(( "\n" ));

    af_glyph_hints_init( hints, face->memory );

    metrics->axis[AF_DIMENSION_HORZ].width_count = 0;
    metrics->axis[AF_DIMENSION_VERT].width_count = 0;

    {
      FT_Error          error;
      FT_ULong          glyph_index;
      int               dim;
      AF_CJKMetricsRec  dummy[1];
      AF_Scaler         scaler = &dummy->root.scaler;

      AF_StyleClass   style_class  = metrics->root.style_class;
      AF_ScriptClass  script_class = af_script_classes[style_class->script];

      /* If HarfBuzz is not available, we need a pointer to a single */
      /* unsigned long value.                                        */
#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      void*     shaper_buf;
#else
      FT_ULong  shaper_buf_;
      void*     shaper_buf = &shaper_buf_;
#endif

      const char*  p;

#ifdef FT_DEBUG_LEVEL_TRACE
      FT_ULong  ch = 0;
#endif

      p = script_class->standard_charstring;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      shaper_buf = af_shaper_buf_create( face );
#endif

      /* We check a list of standard characters.  The first match wins. */

      glyph_index = 0;
      while ( *p )
      {
        unsigned int  num_idx;

#ifdef FT_DEBUG_LEVEL_TRACE
        const char*  p_old;
#endif


        while ( *p == ' ' )
          p++;

#ifdef FT_DEBUG_LEVEL_TRACE
        p_old = p;
        GET_UTF8_CHAR( ch, p_old );
#endif

        /* reject input that maps to more than a single glyph */
        p = af_shaper_get_cluster( p, &metrics->root, shaper_buf, &num_idx );
        if ( num_idx > 1 )
          continue;

        /* otherwise exit loop if we have a result */
        glyph_index = af_shaper_get_elem( &metrics->root,
                                          shaper_buf,
                                          0,
                                          NULL,
                                          NULL );
        if ( glyph_index )
          break;
      }

      af_shaper_buf_destroy( face, shaper_buf );

      if ( !glyph_index )
        goto Exit;

      if ( !glyph_index )
        goto Exit;

      FT_TRACE5(( "standard character: U+%04lX (glyph index %ld)\n",
                  ch, glyph_index ));

      error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
      if ( error || face->glyph->outline.n_points <= 0 )
        goto Exit;

      FT_ZERO( dummy );

      dummy->units_per_em = metrics->units_per_em;

      scaler->x_scale = 0x10000L;
      scaler->y_scale = 0x10000L;
      scaler->x_delta = 0;
      scaler->y_delta = 0;

      scaler->face        = face;
      scaler->render_mode = FT_RENDER_MODE_NORMAL;
      scaler->flags       = 0;

      af_glyph_hints_rescale( hints, (AF_StyleMetrics)dummy );

      error = af_glyph_hints_reload( hints, &face->glyph->outline );
      if ( error )
        goto Exit;

      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_CJKAxis    axis    = &metrics->axis[dim];
        AF_AxisHints  axhints = &hints->axis[dim];
        AF_Segment    seg, limit, link;
        FT_UInt       num_widths = 0;


        error = af_latin_hints_compute_segments( hints,
                                                 (AF_Dimension)dim );
        if ( error )
          goto Exit;

        /*
         * We assume that the glyphs selected for the stem width
         * computation are `featureless' enough so that the linking
         * algorithm works fine without adjustments of its scoring
         * function.
         */
        af_latin_hints_link_segments( hints,
                                      0,
                                      NULL,
                                      (AF_Dimension)dim );

        seg   = axhints->segments;
        limit = seg + axhints->num_segments;

        for ( ; seg < limit; seg++ )
        {
          link = seg->link;

          /* we only consider stem segments there! */
          if ( link && link->link == seg && link > seg )
          {
            FT_Pos  dist;


            dist = seg->pos - link->pos;
            if ( dist < 0 )
              dist = -dist;

            if ( num_widths < AF_CJK_MAX_WIDTHS )
              axis->widths[num_widths++].org = dist;
          }
        }

        /* this also replaces multiple almost identical stem widths */
        /* with a single one (the value 100 is heuristic)           */
        af_sort_and_quantize_widths( &num_widths, axis->widths,
                                     dummy->units_per_em / 100 );
        axis->width_count = num_widths;
      }

    Exit:
      for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
      {
        AF_CJKAxis  axis = &metrics->axis[dim];
        FT_Pos      stdw;


        stdw = ( axis->width_count > 0 ) ? axis->widths[0].org
                                         : AF_LATIN_CONSTANT( metrics, 50 );

        /* let's try 20% of the smallest width */
        axis->edge_distance_threshold = stdw / 5;
        axis->standard_width          = stdw;
        axis->extra_light             = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
        {
          FT_UInt  i;


          FT_TRACE5(( "%s widths:\n",
                      dim == AF_DIMENSION_VERT ? "horizontal"
                                               : "vertical" ));

          FT_TRACE5(( "  %ld (standard)", axis->standard_width ));
          for ( i = 1; i < axis->width_count; i++ )
            FT_TRACE5(( " %ld", axis->widths[i].org ));

          FT_TRACE5(( "\n" ));
        }
#endif
      }
    }

    FT_TRACE5(( "\n" ));

    af_glyph_hints_done( hints );
  }